

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

void __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
delete_root_subtree(olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this
                   )

{
  bool bVar1;
  qsbr *this_00;
  type word;
  basic_node_ptr<unodb::detail::olc_node_header> node;
  reference pvVar2;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  memory_order __b;
  
  this_00 = qsbr::instance();
  word = qsbr::get_state(this_00);
  bVar1 = qsbr_state::single_thread_mode(word);
  if (!bVar1) {
    __assert_fail("qsbr_state::single_thread_mode(qsbr::instance().get_state())",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x662,
                  "void unodb::olc_db<unsigned long, std::span<const std::byte>>::delete_root_subtree() [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  bVar1 = in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::
          operator==(&this->root,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    node = in_critical_section::operator_cast_to_basic_node_ptr((in_critical_section *)&this->root);
    detail::
    basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
    ::delete_subtree(node,this);
  }
  pvVar2 = std::array<std::atomic<unsigned_long>,_5UL>::operator[](&this->node_counts,0);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  if ((pvVar2->super___atomic_base<unsigned_long>)._M_i == 0) {
    return;
  }
  __assert_fail("node_counts[as_i<node_type::LEAF>].load(std::memory_order_relaxed) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0x66a,
                "void unodb::olc_db<unsigned long, std::span<const std::byte>>::delete_root_subtree() [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

void olc_db<Key, Value>::delete_root_subtree() noexcept {
  UNODB_DETAIL_ASSERT(
      qsbr_state::single_thread_mode(qsbr::instance().get_state()));

  if (root != nullptr) art_policy::delete_subtree(root, *this);

#ifdef UNODB_DETAIL_WITH_STATS
  // It is possible to reset the counter to zero instead of decrementing it for
  // each leaf, but not sure the savings will be significant.
  UNODB_DETAIL_ASSERT(
      node_counts[as_i<node_type::LEAF>].load(std::memory_order_relaxed) == 0);
#endif  // UNODB_DETAIL_WITH_STATS
}